

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

JSON * __thiscall JSON::stringEscape(JSON *this,string *str,char ch)

{
  char *pcVar1;
  undefined4 local_24;
  int i;
  int length;
  char ch_local;
  string *str_local;
  
  local_24 = std::__cxx11::string::size();
  while (local_24 = local_24 + -1, -1 < local_24) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)str);
    if (*pcVar1 == ch) {
      std::__cxx11::string::replace((ulong)str,(long)local_24,(char *)0x0);
    }
  }
  std::__cxx11::string::string((string *)this,(string *)str);
  return this;
}

Assistant:

string stringEscape(string str, char ch) {
        int length = str.size();
        int i = length - 1;
        while (i >= 0) {
            if (str[i] == ch) {
                str.replace(i, 0, "\\");
            }
            i--;
        }
        return str;
    }